

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void StoreDataWithHuffmanCodes
               (uint8_t *input,size_t start_pos,size_t mask,Command_conflict *commands,
               size_t n_commands,uint8_t *lit_depth,uint16_t *lit_bits,uint8_t *cmd_depth,
               uint16_t *cmd_bits,uint8_t *dist_depth,uint16_t *dist_bits,size_t *storage_ix,
               uint8_t *storage)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  Command_conflict *pCVar8;
  ulong uVar9;
  uint32_t distextra;
  uint32_t distnumextra;
  size_t dist_code;
  ulong uStack_260;
  uint8_t literal;
  size_t j;
  size_t cmd_code;
  Command_conflict cmd;
  size_t i;
  size_t pos;
  uint8_t *lit_depth_local;
  size_t n_commands_local;
  Command_conflict *commands_local;
  size_t mask_local;
  size_t start_pos_local;
  uint8_t *input_local;
  uint64_t v_4;
  uint8_t *p_4;
  uint64_t v_3;
  uint8_t *p_3;
  uint64_t v_2;
  uint8_t *p_2;
  uint64_t v;
  uint8_t *p;
  uint64_t bits;
  uint64_t copyextraval;
  uint64_t insextraval;
  uint32_t insnumextra;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t copylen_code;
  uint64_t v_1;
  uint8_t *p_1;
  int32_t delta;
  uint32_t modifier;
  uint32_t nbits;
  ushort local_4a;
  uint32_t nbits_1;
  ushort local_22;
  
  cmd.dist_extra_ = 0;
  cmd.cmd_prefix_ = 0;
  cmd.dist_prefix_ = 0;
  i = start_pos;
  for (; (ulong)cmd._8_8_ < n_commands; cmd._8_8_ = cmd._8_8_ + 1) {
    pCVar8 = commands + cmd._8_8_;
    uVar4._0_4_ = pCVar8->insert_len_;
    uVar4._4_4_ = pCVar8->copy_len_;
    uVar5._0_4_ = pCVar8->dist_extra_;
    uVar5._4_2_ = pCVar8->cmd_prefix_;
    uVar5._6_2_ = pCVar8->dist_prefix_;
    uVar9 = uVar5 >> 0x20 & 0xffff;
    bVar1 = cmd_depth[uVar9];
    *(ulong *)(storage + (*storage_ix >> 3)) =
         (ulong)cmd_bits[uVar9] << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)bVar1 + *storage_ix;
    uVar7 = (uVar4._4_4_ & 0x1ffffff) +
            (int)(char)((byte)((uint)uVar4._4_4_ >> 0x19) |
                       (byte)(((uint)uVar4._4_4_ >> 0x19 & 0x40) << 1));
    uVar9 = uVar4 & 0xffffffff;
    if (uVar9 < 6) {
      local_4a = (ushort)(undefined4)uVar4;
    }
    else if (uVar9 < 0x82) {
      iVar6 = 0x1f;
      if ((undefined4)uVar4 - 2 != 0) {
        for (; (undefined4)uVar4 - 2 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      local_4a = (short)(iVar6 + -1) * 2 + (short)(uVar9 - 2 >> ((byte)(iVar6 + -1) & 0x3f)) + 2;
    }
    else if (uVar9 < 0x842) {
      iVar6 = 0x1f;
      if ((undefined4)uVar4 - 0x42 != 0) {
        for (; (undefined4)uVar4 - 0x42 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      local_4a = (short)iVar6 + 10;
    }
    else if (uVar9 < 0x1842) {
      local_4a = 0x15;
    }
    else if (uVar9 < 0x5842) {
      local_4a = 0x16;
    }
    else {
      local_4a = 0x17;
    }
    uVar9 = (ulong)uVar7;
    if (uVar9 < 10) {
      local_22 = (short)uVar7 - 2;
    }
    else if (uVar9 < 0x86) {
      iVar6 = 0x1f;
      if (uVar7 - 6 != 0) {
        for (; uVar7 - 6 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      local_22 = (short)(iVar6 + -1) * 2 + (short)(uVar9 - 6 >> ((byte)(iVar6 + -1) & 0x3f)) + 4;
    }
    else if (uVar9 < 0x846) {
      iVar6 = 0x1f;
      if (uVar7 - 0x46 != 0) {
        for (; uVar7 - 0x46 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      local_22 = (short)iVar6 + 0xc;
    }
    else {
      local_22 = 0x17;
    }
    uVar2 = kInsExtra[local_4a];
    uVar3 = kCopyExtra[local_22];
    *(ulong *)(storage + (*storage_ix >> 3)) =
         ((ulong)(uVar7 - kCopyBase[local_22]) << ((byte)uVar2 & 0x3f) |
         (ulong)((undefined4)uVar4 - kInsBase[local_4a])) << ((byte)*storage_ix & 7) |
         (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
    *storage_ix = (ulong)(uVar2 + uVar3) + *storage_ix;
    for (uStack_260 = uVar4 & 0xffffffff; uStack_260 != 0; uStack_260 = uStack_260 - 1) {
      bVar1 = lit_depth[input[i & mask]];
      *(ulong *)(storage + (*storage_ix >> 3)) =
           (ulong)lit_bits[input[i & mask]] << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = (ulong)bVar1 + *storage_ix;
      i = i + 1;
    }
    i = (uVar4._4_4_ & 0x1ffffff) + i;
    if (((uVar4 & 0x1ffffff00000000) != 0) && (0x7f < (ushort)uVar5._4_2_)) {
      bVar1 = dist_depth[(int)((ushort)uVar5._6_2_ & 0x3ff)];
      *(ulong *)(storage + (*storage_ix >> 3)) =
           (ulong)dist_bits[(int)((ushort)uVar5._6_2_ & 0x3ff)] << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = (ulong)bVar1 + *storage_ix;
      *(ulong *)(storage + (*storage_ix >> 3)) =
           (uVar5 & 0xffffffff) << ((byte)*storage_ix & 7) |
           (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
      *storage_ix = (ulong)(uint)((int)(uint)(ushort)uVar5._6_2_ >> 10) + *storage_ix;
    }
  }
  return;
}

Assistant:

static void StoreDataWithHuffmanCodes(const uint8_t* input,
                                      size_t start_pos,
                                      size_t mask,
                                      const Command* commands,
                                      size_t n_commands,
                                      const uint8_t* lit_depth,
                                      const uint16_t* lit_bits,
                                      const uint8_t* cmd_depth,
                                      const uint16_t* cmd_bits,
                                      const uint8_t* dist_depth,
                                      const uint16_t* dist_bits,
                                      size_t* storage_ix,
                                      uint8_t* storage) {
  size_t pos = start_pos;
  size_t i;
  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    const size_t cmd_code = cmd.cmd_prefix_;
    size_t j;
    BrotliWriteBits(
        cmd_depth[cmd_code], cmd_bits[cmd_code], storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    for (j = cmd.insert_len_; j != 0; --j) {
      const uint8_t literal = input[pos & mask];
      BrotliWriteBits(
          lit_depth[literal], lit_bits[literal], storage_ix, storage);
      ++pos;
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd) && cmd.cmd_prefix_ >= 128) {
      const size_t dist_code = cmd.dist_prefix_ & 0x3FF;
      const uint32_t distnumextra = cmd.dist_prefix_ >> 10;
      const uint32_t distextra = cmd.dist_extra_;
      BrotliWriteBits(dist_depth[dist_code], dist_bits[dist_code],
                      storage_ix, storage);
      BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
    }
  }
}